

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_log.hpp
# Opt level: O2

string * __thiscall
pstore::
basic_rotating_log<(anonymous_namespace)::mock_string_stream_traits,(anonymous_namespace)::mock_file_system_traits>
::make_file_name_abi_cxx11_(string *__return_storage_ptr__,void *this,uint index)

{
  ostream *poVar1;
  ostringstream str;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&str);
  std::operator<<((ostream *)&str,(string *)((long)this + 0x58));
  if (index != 0) {
    poVar1 = std::operator<<((ostream *)&str,'.');
    std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&str);
  return __return_storage_ptr__;
}

Assistant:

std::string basic_rotating_log<StreamTraits, FileSystemTraits>::make_file_name (
        unsigned const index) const {
        std::ostringstream str;
        str << base_name_;
        if (index > 0) {
            str << '.' << index;
        }
        return str.str ();
    }